

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<cmCTestResourceSpec> * __thiscall
cmJSONHelperBuilder::Object<cmCTestResourceSpec>::
Bind<cmCTestResourceSpec,cmCTestResourceSpec::Socket,std::function<bool(cmCTestResourceSpec::Socket&,Json::Value_const*,cmJSONState*)>>
          (Object<cmCTestResourceSpec> *this,string_view *name,
          offset_in_cmCTestResourceSpec_to_Socket member,
          function<bool_(cmCTestResourceSpec::Socket_&,_const_Json::Value_*,_cmJSONState_*)> *func,
          bool required)

{
  Object<cmCTestResourceSpec> *pOVar1;
  MemberFunction local_70;
  anon_class_40_2_315d8239 local_50;
  
  std::function<bool_(cmCTestResourceSpec::Socket_&,_const_Json::Value_*,_cmJSONState_*)>::function
            (&local_50.func,func);
  local_50.member = member;
  std::function<bool(cmCTestResourceSpec&,Json::Value_const*,cmJSONState*)>::
  function<cmJSONHelperBuilder::Object<cmCTestResourceSpec>::Bind<cmCTestResourceSpec,cmCTestResourceSpec::Socket,std::function<bool(cmCTestResourceSpec::Socket&,Json::Value_const*,cmJSONState*)>>(std::basic_string_view<char,std::char_traits<char>>const&,cmCTestResourceSpec::Socket_cmCTestResourceSpec::*,std::function<bool(cmCTestResourceSpec::Socket&,Json::Value_const*,cmJSONState*)>,bool)::_lambda(cmCTestResourceSpec&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(cmCTestResourceSpec&,Json::Value_const*,cmJSONState*)> *)&local_70,
             &local_50);
  pOVar1 = BindPrivate(this,name,&local_70,required);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(
        name,
        [func, member](T& out, const Json::Value* value, cmJSONState* state)
          -> bool { return func(out.*member, value, state); },
        required);
    }